

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Shape.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Shape_Material(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var9;
  aiColor3D *pValue;
  string *psVar10;
  int pAttrIdx;
  ulong uVar11;
  CX3DImporter_NodeElement *ne;
  aiColor3D specularColor;
  aiColor3D emissiveColor;
  aiColor3D diffuseColor;
  string an;
  string def;
  string use;
  CX3DImporter_NodeElement *local_d0;
  float local_c8;
  float local_c4;
  float local_c0;
  allocator local_b9;
  uint local_b8;
  aiColor3D local_b4;
  aiColor3D local_a8;
  aiColor3D local_9c;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_9c.r = 0.8;
  local_9c.g = 0.8;
  local_9c.b = 0.8;
  local_a8.r = 0.0;
  local_a8.g = 0.0;
  local_a8.b = 0.0;
  local_b4.r = 0.0;
  local_b4.g = 0.0;
  local_b4.b = 0.0;
  local_d0 = (CX3DImporter_NodeElement *)0x0;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar7 < 1) {
    local_c8 = 0.0;
    local_c4 = 0.2;
    local_c0 = 0.2;
  }
  else {
    local_c8 = 0.0;
    uVar11 = 0;
    local_c0 = 0.2;
    local_c4 = 0.2;
    local_b8 = uVar7;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar11;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar11);
      std::__cxx11::string::string
                ((string *)&local_90,(char *)CONCAT44(extraout_var,iVar8),&local_b9);
      iVar8 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar8);
        psVar10 = &local_70;
LAB_00635ff9:
        pcVar3 = (char *)psVar10->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar3,(ulong)__s);
        uVar7 = local_b8;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar8);
          psVar10 = &local_50;
          goto LAB_00635ff9;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_90);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_90), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)&local_90), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)&local_90);
          if (iVar8 == 0) {
            local_c0 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_90);
            if (iVar8 == 0) {
              local_c4 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)&local_90);
              if (iVar8 == 0) {
                local_c8 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)&local_90);
                pValue = &local_9c;
                if (iVar8 != 0) {
                  iVar8 = std::__cxx11::string::compare((char *)&local_90);
                  pValue = &local_a8;
                  if (iVar8 != 0) {
                    iVar8 = std::__cxx11::string::compare((char *)&local_90);
                    pValue = &local_b4;
                    if (iVar8 != 0) {
                      Throw_IncorrectAttr(this,&local_90);
                      goto LAB_0063601c;
                    }
                  }
                }
                XML_ReadNode_GetAttrVal_AsCol3f(this,pAttrIdx,pValue);
              }
            }
          }
        }
      }
LAB_0063601c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      uVar11 = (ulong)(pAttrIdx + 1U);
    } while (uVar7 != pAttrIdx + 1U);
  }
  if (local_50._M_string_length == 0) {
    local_d0 = (CX3DImporter_NodeElement *)operator_new(0x80);
    pCVar4 = this->NodeElement_Cur;
    local_d0->Type = ENET_Material;
    (local_d0->ID)._M_dataplus._M_p = (pointer)&(local_d0->ID).field_2;
    (local_d0->ID)._M_string_length = 0;
    (local_d0->ID).field_2._M_local_buf[0] = '\0';
    local_d0->Parent = pCVar4;
    (local_d0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_d0->Child;
    (local_d0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_d0->Child;
    (local_d0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_d0->_vptr_CX3DImporter_NodeElement = (_func_int **)&PTR__CX3DImporter_NodeElement_009d00d0
    ;
    local_d0[1]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_d0[1].Type = 0;
    local_d0[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_d0[1].ID._M_string_length = 0;
    *(undefined8 *)((long)&local_d0[1].ID._M_string_length + 4) = 0;
    *(undefined8 *)((long)&local_d0[1].ID.field_2 + 4) = 0;
    *(undefined4 *)((long)&local_d0[1].ID.field_2 + 0xc) = 0x3f800000;
    if (local_70._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_d0->ID);
    }
    *(float *)&local_d0[1]._vptr_CX3DImporter_NodeElement = local_c0;
    *(float *)((long)&local_d0[1].ID._M_string_length + 4) = local_c4;
    *(float *)((long)&local_d0[1].ID.field_2 + 0xc) = local_c8;
    *(ai_real *)((long)&local_d0[1]._vptr_CX3DImporter_NodeElement + 4) = local_9c.r;
    local_d0[1].Type = (EType)local_9c.g;
    *(ai_real *)&local_d0[1].field_0xc = local_9c.b;
    *(ai_real *)&local_d0[1].ID._M_dataplus._M_p = local_a8.r;
    *(ai_real *)((long)&local_d0[1].ID._M_dataplus._M_p + 4) = local_a8.g;
    *(ai_real *)&local_d0[1].ID._M_string_length = local_a8.b;
    *(ai_real *)&local_d0[1].ID.field_2 = local_b4.r;
    *(ai_real *)((long)&local_d0[1].ID.field_2 + 4) = local_b4.g;
    *(ai_real *)((long)&local_d0[1].ID.field_2 + 8) = local_b4.b;
    iVar8 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar4 = local_d0;
    if ((char)iVar8 == '\0') {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Material","");
      ParseNode_Metadata(this,pCVar4,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)local_d0;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_d0;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_50,ENET_Material,&local_d0);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_50);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_d0;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &pCVar4->Child;
  }
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Shape_Material()
{
    std::string use, def;
    float ambientIntensity = 0.2f;
    float shininess = 0.2f;
    float transparency = 0;
    aiColor3D diffuseColor(0.8f, 0.8f, 0.8f);
    aiColor3D emissiveColor(0, 0, 0);
    aiColor3D specularColor(0, 0, 0);
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ambientIntensity", ambientIntensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("shininess", shininess, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("transparency", transparency, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("diffuseColor", diffuseColor, XML_ReadNode_GetAttrVal_AsCol3f);
		MACRO_ATTRREAD_CHECK_REF("emissiveColor", emissiveColor, XML_ReadNode_GetAttrVal_AsCol3f);
		MACRO_ATTRREAD_CHECK_REF("specularColor", specularColor, XML_ReadNode_GetAttrVal_AsCol3f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Material, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Material(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_Material*)ne)->AmbientIntensity = ambientIntensity;
		((CX3DImporter_NodeElement_Material*)ne)->Shininess = shininess;
		((CX3DImporter_NodeElement_Material*)ne)->Transparency = transparency;
		((CX3DImporter_NodeElement_Material*)ne)->DiffuseColor = diffuseColor;
		((CX3DImporter_NodeElement_Material*)ne)->EmissiveColor = emissiveColor;
		((CX3DImporter_NodeElement_Material*)ne)->SpecularColor = specularColor;
        // check for child nodes
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Material");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}